

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O0

rgb_pixel __thiscall dlib::drawable_window::background_color(drawable_window *this)

{
  rgb_pixel rVar1;
  auto_mutex *in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffffb8;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffb8);
  rVar1 = *(rgb_pixel *)&in_RDI[3].m;
  auto_mutex::~auto_mutex((auto_mutex *)0x4986a5);
  return rVar1;
}

Assistant:

rgb_pixel drawable_window::
    background_color (
    ) const
    {
        auto_mutex M(wm);
        return bg_color;
    }